

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_time.c
# Opt level: O0

int p2sc_string2date(char *iso_date,double *d)

{
  byte *pbVar1;
  double *in_RSI;
  byte *in_RDI;
  glong mul;
  long val;
  long usec;
  long sec;
  long min;
  long hour;
  long mday;
  long mon;
  long year;
  char *date;
  long local_68;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  byte *local_20;
  double *local_18;
  int local_4;
  
  local_58 = 0;
  local_20 = in_RDI;
  while ((*(ushort *)(_g_ascii_table + (ulong)*local_20 * 2) & 0x100) != 0) {
    local_20 = local_20 + 1;
  }
  if (*local_20 == 0) {
    local_4 = -1;
  }
  else if ((((*(ushort *)(_g_ascii_table + (ulong)*local_20 * 2) & 8) == 0) && (*local_20 != 0x2d))
          && (*local_20 != 0x2b)) {
    local_4 = -1;
  }
  else {
    local_18 = in_RSI;
    local_28 = strtol((char *)local_20,(char **)&local_20,10);
    if (*local_20 == 0x2d) {
      local_20 = local_20 + 1;
      local_30 = strtol((char *)local_20,(char **)&local_20,10);
      pbVar1 = local_20 + 1;
      if (*local_20 != 0x2d) {
        return -1;
      }
      local_20 = pbVar1;
      local_38 = strtol((char *)pbVar1,(char **)&local_20,10);
    }
    else {
      local_38 = local_28 % 100;
      local_30 = (local_28 % 10000) / 100;
      local_28 = local_28 / 10000;
    }
    pbVar1 = local_20 + 1;
    if (*local_20 == 0x54) {
      local_20 = pbVar1;
      local_40 = strtol((char *)pbVar1,(char **)&local_20,10);
      if (*local_20 == 0x3a) {
        local_20 = local_20 + 1;
        local_48 = strtol((char *)local_20,(char **)&local_20,10);
        pbVar1 = local_20 + 1;
        if (*local_20 != 0x3a) {
          return -1;
        }
        local_20 = pbVar1;
        local_50 = strtol((char *)pbVar1,(char **)&local_20,10);
      }
      else {
        local_50 = local_40 % 100;
        local_48 = (local_40 % 10000) / 100;
        local_40 = local_40 / 10000;
      }
      if (*local_20 == 0x2e) {
        local_68 = 100000;
        while ((*(ushort *)(_g_ascii_table + (ulong)local_20[1] * 2) & 8) != 0) {
          local_58 = ((char)local_20[1] + -0x30) * local_68 + local_58;
          local_68 = local_68 / 10;
          local_20 = local_20 + 1;
        }
        if (local_50 < 0) {
          local_58 = -local_58;
        }
      }
      *local_18 = (double)local_28;
      local_18[1] = (double)local_30;
      local_18[2] = (double)local_38;
      local_18[3] = (double)local_40;
      local_18[4] = (double)local_48;
      local_18[5] = (double)local_50 + (double)local_58 / 1000000.0;
      local_4 = 0;
    }
    else {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int p2sc_string2date(const char *iso_date, double d[6]) {
    char *date = (char *) iso_date;
    long year, mon, mday, hour, min, sec, usec = 0;
    long val;

    while (g_ascii_isspace(*date))
        date++;

    if (*date == '\0')
        return -1;

    if (!g_ascii_isdigit(*date) && *date != '-' && *date != '+')
        return -1;

    val = strtol(date, &date, 10);
    if (*date == '-') {
        // YYYY-MM-DD
        year = val;
        date++;
        mon = strtol(date, &date, 10);

        if (*date++ != '-')
            return -1;

        mday = strtol(date, &date, 10);
    } else {
        // YYYYMMDD
        mday = val % 100;
        mon = (val % 10000) / 100;
        year = val / 10000;
    }

    if (*date++ != 'T')
        return -1;

    val = strtol(date, &date, 10);
    if (*date == ':') {
        // hh:mm:ss
        hour = val;
        date++;
        min = strtol(date, &date, 10);

        if (*date++ != ':')
            return -1;

        sec = strtol(date, &date, 10);
    } else {
        // hhmmss
        sec = val % 100;
        min = (val % 10000) / 100;
        hour = val / 10000;
    }

    if (*date == '.') {
        glong mul = 100000;

        while (g_ascii_isdigit(*++date)) {
            usec += (*date - '0') * mul;
            mul /= 10;
        }
        if (sec < 0)
            usec = -usec;
    }

    d[0] = year;
    d[1] = mon;
    d[2] = mday;
    d[3] = hour;
    d[4] = min;
    d[5] = sec + usec / 1000000.;

    return 0;
}